

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::ShaderCompilerCase::cleanup(ShaderCompilerCase *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  code *pcVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  size_type sVar6;
  undefined8 uVar7;
  byte in_CL;
  long in_RDX;
  int local_34;
  int location;
  int attribNdx;
  Functions *gl;
  bool linkSuccess_local;
  ProgramContext *progCtx_local;
  ShadersAndProgram *shadersAndProgram_local;
  ShaderCompilerCase *this_local;
  long lVar5;
  
  pRVar4 = gles2::Context::getRenderContext((this->super_TestCase).m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  if ((in_CL & 1) != 0) {
    for (local_34 = 0;
        sVar6 = std::
                vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                ::size((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                        *)(in_RDX + 0x40)), local_34 < (int)sVar6; local_34 = local_34 + 1) {
      pcVar2 = *(code **)(lVar5 + 0x780);
      uVar1 = *(undefined4 *)(ctx + 8);
      std::
      vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
      ::operator[]((vector<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec,_std::allocator<deqp::gles2::Performance::ShaderCompilerCase::AttribSpec>_>
                    *)(in_RDX + 0x40),(long)local_34);
      uVar7 = std::__cxx11::string::c_str();
      iVar3 = (*pcVar2)(uVar1,uVar7);
      if (-1 < iVar3) {
        (**(code **)(lVar5 + 0x518))(iVar3);
      }
    }
  }
  (**(code **)(lVar5 + 0x1680))(0);
  (**(code **)(lVar5 + 0x4e0))(*(undefined4 *)(ctx + 8),*(undefined4 *)ctx);
  (**(code **)(lVar5 + 0x4e0))(*(undefined4 *)(ctx + 8),*(undefined4 *)(ctx + 4));
  (**(code **)(lVar5 + 0x470))(*(undefined4 *)ctx);
  (**(code **)(lVar5 + 0x470))(*(undefined4 *)(ctx + 4));
  (**(code **)(lVar5 + 0x448))(*(undefined4 *)(ctx + 8));
  return;
}

Assistant:

void ShaderCompilerCase::cleanup (const ShadersAndProgram& shadersAndProgram, const ProgramContext& progCtx, bool linkSuccess) const
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (linkSuccess)
	{
		for (int attribNdx = 0; attribNdx < (int)progCtx.vertexAttributes.size(); attribNdx++)
		{
			int location = gl.getAttribLocation(shadersAndProgram.program, progCtx.vertexAttributes[attribNdx].name.c_str());
			if (location >= 0)
				gl.disableVertexAttribArray(location);
		}
	}

	gl.useProgram(0);
	gl.detachShader(shadersAndProgram.program, shadersAndProgram.vertShader);
	gl.detachShader(shadersAndProgram.program, shadersAndProgram.fragShader);
	gl.deleteShader(shadersAndProgram.vertShader);
	gl.deleteShader(shadersAndProgram.fragShader);
	gl.deleteProgram(shadersAndProgram.program);
}